

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_insufficient_funds_Test::TestBody
          (CoinSelection_SelectCoins_Simple_Error_SelectCoinsBnB_insufficient_funds_Test *this)

{
  bool bVar1;
  iterator this_00;
  ulong uVar2;
  Amount AVar3;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Txid txid;
  TestUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *__range1;
  iterator ite;
  bool use_bnb;
  Amount tx_fee;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  Amount fee_value;
  Amount select_value;
  CoinSelectionOption option_params;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  Amount target_value;
  CoinSelection coin_select;
  void *in_stack_00000318;
  string *in_stack_00000320;
  Amount *in_stack_00000328;
  string *in_stack_00000330;
  uint32_t in_stack_0000033c;
  Txid *in_stack_00000340;
  Utxo *in_stack_00000350;
  Script *in_stack_00000358;
  reference in_stack_fffffffffffffd48;
  CoinSelectionOption *in_stack_fffffffffffffd50;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *__x;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffd60;
  size_type in_stack_fffffffffffffd68;
  undefined6 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd76;
  undefined1 in_stack_fffffffffffffd77;
  AssertHelper local_240;
  Message local_238 [6];
  byte local_201;
  ConstCharPtr local_200;
  allocator local_1f1;
  string local_1f0 [32];
  int64_t local_1d0;
  undefined1 local_1c8;
  int64_t local_1c0;
  undefined1 local_1b8;
  Txid local_1b0;
  Txid local_190;
  reference local_170;
  TestUtxoCoinVector *local_168;
  __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
  local_160;
  vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *local_158;
  undefined1 local_141 [25];
  undefined1 local_128;
  undefined1 local_108 [48];
  CoinSelectionOption *in_stack_ffffffffffffff28;
  UtxoFilter *in_stack_ffffffffffffff30;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffff38;
  Amount *in_stack_ffffffffffffff40;
  CoinSelection *in_stack_ffffffffffffff48;
  Amount *in_stack_ffffffffffffff60;
  Amount *in_stack_ffffffffffffff68;
  Amount *in_stack_ffffffffffffff70;
  bool *in_stack_ffffffffffffff78;
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffffd50,
             SUB81((ulong)in_stack_fffffffffffffd48 >> 0x38,0));
  cfd::core::Amount::CreateBySatoshiAmount(500000000);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x270cd9);
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffd50);
  cfd::core::Amount::Amount((Amount *)(local_108 + 0x10));
  cfd::core::Amount::Amount((Amount *)local_108);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x270d13);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_141._1_8_ = AVar3.amount_;
  local_141[9] = AVar3.ignore_check_;
  local_141[0] = 0;
  local_141._17_8_ = local_141._1_8_;
  local_128 = local_141[9];
  std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::size
            (&kExtCoinSelectTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT17(in_stack_fffffffffffffd77,
                      CONCAT16(in_stack_fffffffffffffd76,in_stack_fffffffffffffd70)),
             in_stack_fffffffffffffd68);
  this_00 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                      ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffd48);
  local_158 = &kExtCoinSelectTestVector;
  local_160._M_current =
       (TestUtxoCoinVector *)
       std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::begin
                 ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                  in_stack_fffffffffffffd48);
  local_168 = (TestUtxoCoinVector *)
              std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>::end
                        ((vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_> *)
                         in_stack_fffffffffffffd48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffd50,
                            (__normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffd48), bVar1) {
    local_170 = __gnu_cxx::
                __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
                ::operator*(&local_160);
    cfd::core::Txid::Txid(&local_190);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1b0,&local_170->txid);
      cfd::core::Txid::operator=(&local_190,&local_1b0);
      cfd::core::Txid::~Txid((Txid *)0x270e62);
    }
    AVar3 = cfd::core::Amount::CreateBySatoshiAmount(local_170->amount);
    local_1d0 = AVar3.amount_;
    local_1c8 = AVar3.ignore_check_;
    local_1c0 = local_1d0;
    local_1b8 = local_1c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"",&local_1f1);
    in_stack_fffffffffffffd48 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                    *)&stack0xfffffffffffffeb0);
    in_stack_fffffffffffffd50 = (CoinSelectionOption *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_00000340,in_stack_0000033c,in_stack_00000330,in_stack_00000328,
               in_stack_00000320,in_stack_00000318,in_stack_00000350,in_stack_00000358);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++((__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>
                *)&stack0xfffffffffffffeb0);
    cfd::core::Txid::~Txid((Txid *)0x27101b);
    __gnu_cxx::
    __normal_iterator<const_TestUtxoCoinVector_*,_std::vector<TestUtxoCoinVector,_std::allocator<TestUtxoCoinVector>_>_>
    ::operator++(&local_160);
  }
  cfd::CoinSelectionOption::InitializeTxSizeInfo((CoinSelectionOption *)this_00._M_current);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffd50,(double)in_stack_fffffffffffffd48);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_200,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_200);
  if (bVar1) {
    local_201 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffd60 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_141;
      __x = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_108;
      cfd::CoinSelection::SelectCoins
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=(in_stack_fffffffffffffd60,__x);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd60);
    }
    if ((local_201 & 1) != 0) goto LAB_002712d0;
    local_200.value =
         "Expected: (select_utxos = coin_select.SelectCoins(target_value, utxos, exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_238);
  testing::internal::AssertHelper::AssertHelper
            (&local_240,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
             ,0x253,local_200.value);
  testing::internal::AssertHelper::operator=(&local_240,local_238);
  testing::internal::AssertHelper::~AssertHelper(&local_240);
  testing::Message::~Message((Message *)0x27128b);
LAB_002712d0:
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd60);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2712ea);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffd60);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x271304);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_Simple_Error_SelectCoinsBnB_insufficient_funds)
{
  CoinSelection coin_select(true);

  Amount target_value = Amount::CreateBySatoshiAmount(500000000);
  std::vector<Utxo> utxos;
  CoinSelectionOption option_params;
  Amount select_value;
  Amount fee_value;
  std::vector<Utxo> select_utxos;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  bool use_bnb = false;

  utxos.resize(kExtCoinSelectTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), "", nullptr,
        &(*ite));
    ++ite;
  }

  option_params.InitializeTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);

  EXPECT_THROW((select_utxos = coin_select.SelectCoins(target_value, utxos,
      exp_filter, option_params, tx_fee, &select_value, &fee_value, &use_bnb)), CfdException);
}